

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiexsas.c
# Opt level: O2

HTTPAPIEX_RESULT
HTTPAPIEX_SAS_ExecuteRequest
          (HTTPAPIEX_SAS_HANDLE sasHandle,HTTPAPIEX_HANDLE handle,HTTPAPI_REQUEST_TYPE requestType,
          char *relativePath,HTTP_HEADERS_HANDLE requestHttpHeadersHandle,
          BUFFER_HANDLE requestContent,uint *statusCode,HTTP_HEADERS_HANDLE responseHeadersHandle,
          BUFFER_HANDLE responseContent)

{
  int iVar1;
  HTTP_HEADERS_RESULT HVar2;
  HTTPAPIEX_RESULT HVar3;
  char *pcVar4;
  time_t stopTime;
  ulong uVar5;
  STRING_HANDLE handle_00;
  LOGGER_LOG p_Var6;
  double dVar7;
  
  if (requestHttpHeadersHandle != (HTTP_HEADERS_HANDLE)0x0 && sasHandle != (HTTPAPIEX_SAS_HANDLE)0x0
     ) {
    pcVar4 = HTTPHeaders_FindHeaderValue(requestHttpHeadersHandle,"Authorization");
    if (pcVar4 != (char *)0x0) {
      stopTime = get_time((time_t *)0x0);
      if (stopTime == -1) {
        p_Var6 = xlogging_get_log_function();
        if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_00163c78;
        pcVar4 = "Time does not appear to be working.";
        iVar1 = 0x99;
      }
      else {
        pcVar4 = sasHandle->key;
        iVar1 = strncmp(pcVar4,"sas=",4);
        if (iVar1 == 0) {
          handle_00 = STRING_construct(pcVar4 + 4);
        }
        else {
          dVar7 = get_difftime(stopTime,0);
          uVar5 = (ulong)(dVar7 + 3600.0);
          handle_00 = SASToken_CreateString
                                (sasHandle->key,sasHandle->uriResource,sasHandle->keyName,
                                 (long)((dVar7 + 3600.0) - 9.223372036854776e+18) &
                                 (long)uVar5 >> 0x3f | uVar5);
        }
        if (handle_00 != (STRING_HANDLE)0x0) {
          pcVar4 = STRING_c_str(handle_00);
          HVar2 = HTTPHeaders_ReplaceHeaderNameValuePair
                            (requestHttpHeadersHandle,"Authorization",pcVar4);
          if (HVar2 != HTTP_HEADERS_OK) {
            p_Var6 = xlogging_get_log_function();
            if (p_Var6 != (LOGGER_LOG)0x0) {
              (*p_Var6)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiexsas.c"
                        ,"HTTPAPIEX_SAS_ExecuteRequest",0xb1,1,
                        "Unable to replace the old SAS Token.");
            }
          }
          STRING_delete(handle_00);
          goto LAB_00163c78;
        }
        p_Var6 = xlogging_get_log_function();
        if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_00163c78;
        pcVar4 = "Unable to create a new SAS token.";
        iVar1 = 0xb8;
      }
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiexsas.c"
                ,"HTTPAPIEX_SAS_ExecuteRequest",iVar1,1,pcVar4);
    }
  }
LAB_00163c78:
  HVar3 = HTTPAPIEX_ExecuteRequest
                    (handle,requestType,relativePath,requestHttpHeadersHandle,requestContent,
                     statusCode,responseHeadersHandle,responseContent);
  return HVar3;
}

Assistant:

HTTPAPIEX_RESULT HTTPAPIEX_SAS_ExecuteRequest(HTTPAPIEX_SAS_HANDLE sasHandle, HTTPAPIEX_HANDLE handle, HTTPAPI_REQUEST_TYPE requestType, const char* relativePath, HTTP_HEADERS_HANDLE requestHttpHeadersHandle, BUFFER_HANDLE requestContent, unsigned int* statusCode, HTTP_HEADERS_HANDLE responseHeadersHandle, BUFFER_HANDLE responseContent)
{
    /*Codes_SRS_HTTPAPIEXSAS_06_007: [If the parameter sasHandle is NULL then HTTPAPIEX_SAS_ExecuteRequest shall simply invoke HTTPAPIEX_ExecuteRequest with the remaining parameters (following sasHandle) as its arguments and shall return immediately with the result of that call as the result of HTTPAPIEX_SAS_ExecuteRequest.]*/
    if (sasHandle != NULL)
    {
        /*Codes_SRS_HTTPAPIEXSAS_06_008: [if the parameter requestHttpHeadersHandle is NULL then fallthrough.]*/
        if (requestHttpHeadersHandle != NULL)
        {
            /*Codes_SRS_HTTPAPIEXSAS_06_009: [HTTPHeaders_FindHeaderValue shall be invoked with the requestHttpHeadersHandle as its first argument and the string "Authorization" as its second argument.]*/
            /*Codes_SRS_HTTPAPIEXSAS_06_010: [If the return result of the invocation of HTTPHeaders_FindHeaderValue is NULL then fallthrough.]*/
            if (HTTPHeaders_FindHeaderValue(requestHttpHeadersHandle, "Authorization") != NULL)
            {
                HTTPAPIEX_SAS_STATE* state = (HTTPAPIEX_SAS_STATE*)sasHandle;
                /*Codes_SRS_HTTPAPIEXSAS_06_018: [A value of type time_t that shall be known as currentTime is obtained from calling get_time.]*/
                time_t currentTime = get_time(NULL);
                /*Codes_SRS_HTTPAPIEXSAS_06_019: [If the value of currentTime is (time_t)-1 is then fallthrough.]*/
                if (currentTime == (time_t)-1)
                {
                    LogError("Time does not appear to be working.");
                }
                else
                {
                    STRING_HANDLE newSASToken = NULL;
                    if (strncmp(state->key, SHARED_ACCESS_SIGNATURE_PREFIX, 4) == 0)
                    {
                        /*Codes_SRS_HTTPAPIEXSAS_06_017: [If state->key is prefixed with "sas=", SharedAccessSignature will be used rather than created.  STRING_construct will be invoked.]*/
                        newSASToken = STRING_construct(&state->key[4]);
                    }
                    else
                    {
                        /*Codes_SRS_HTTPAPIEXSAS_06_011: [SASToken_Create shall be invoked.]*/
                        /*Codes_SRS_HTTPAPIEXSAS_06_012: [If the return result of SASToken_Create is NULL then fallthrough.]*/
                        uint64_t expiry = (uint64_t)(get_difftime(currentTime, 0) + 3600);
                        newSASToken = SASToken_CreateString(state->key, state->uriResource, state->keyName, expiry);
                    }

                    if (newSASToken != NULL)
                    {
                        /*Codes_SRS_HTTPAPIEXSAS_06_013: [HTTPHeaders_ReplaceHeaderNameValuePair shall be invoked with "Authorization" as its second argument and STRING_c_str (newSASToken) as its third argument.]*/
                        if (HTTPHeaders_ReplaceHeaderNameValuePair(requestHttpHeadersHandle, "Authorization", STRING_c_str(newSASToken)) != HTTP_HEADERS_OK)
                        {
                            /*Codes_SRS_HTTPAPIEXSAS_06_014: [If the result of the invocation of HTTPHeaders_ReplaceHeaderNameValuePair is NOT HTTP_HEADERS_OK then fallthrough.]*/
                            LogError("Unable to replace the old SAS Token.");
                        }
                        /*Codes_SRS_HTTPAPIEXSAS_06_015: [STRING_delete(newSASToken) will be invoked.]*/
                        STRING_delete(newSASToken);
                    }
                    else
                    {
                        LogError("Unable to create a new SAS token.");
                    }
                }
            }
        }
    }
    /*Codes_SRS_HTTPAPIEXSAS_06_016: [HTTPAPIEX_ExecuteRequest with the remaining parameters (following sasHandle) as its arguments will be invoked and the result of that call is the result of HTTPAPIEX_SAS_ExecuteRequest.]*/
    return HTTPAPIEX_ExecuteRequest(handle,requestType,relativePath,requestHttpHeadersHandle,requestContent,statusCode,responseHeadersHandle,responseContent);
}